

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

string * __thiscall
czh::error::location_to_str_abi_cxx11_
          (string *__return_storage_ptr__,error *this,source_location *l)

{
  uint_least32_t __val;
  char *pcVar1;
  string local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  error *local_18;
  source_location *l_local;
  
  local_18 = this;
  l_local = (source_location *)__return_storage_ptr__;
  pcVar1 = std::source_location::file_name((source_location *)this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar1,&local_b9);
  std::operator+(&local_98,&local_b8,":");
  __val = std::source_location::line((source_location *)local_18);
  std::__cxx11::to_string(&local_f0,__val);
  std::operator+(&local_78,&local_98,&local_f0);
  std::operator+(&local_58,&local_78,":");
  pcVar1 = std::source_location::function_name((source_location *)local_18);
  std::operator+(&local_38,&local_58,pcVar1);
  std::operator+(__return_storage_ptr__,&local_38,"()");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  return __return_storage_ptr__;
}

Assistant:

std::string location_to_str(const std::source_location &l)
  {
    return std::string(l.file_name()) + ":" + std::to_string(l.line()) +
           ":" + l.function_name() + "()";
  }